

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmLocalGenerator *this_00;
  pointer pcVar3;
  pointer puVar4;
  cmGeneratedFileStream *fout_00;
  int iVar5;
  TargetType TVar6;
  string *makeArgs;
  string *path;
  ostream *poVar7;
  string *psVar8;
  cmValue cVar9;
  char *pcVar10;
  pointer puVar11;
  pointer puVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string currentDir;
  string fastTarget;
  string local_c8;
  cmExtraKateGenerator *local_a8;
  undefined4 local_9c;
  cmGeneratedFileStream *local_98;
  string *local_90;
  string *local_88;
  string local_80;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  pcVar1 = lg->Makefile;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_a8 = this;
  local_98 = fout;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_MAKE_PROGRAM","");
  local_90 = cmMakefile::GetRequiredDefinition(pcVar1,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"CMAKE_KATE_MAKE_ARGUMENTS","");
  makeArgs = cmMakefile::GetSafeDefinition(pcVar1,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  fout_00 = local_98;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_98,"\t\"build\": {\n\t\t\"directory\": \"",0x1c);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout_00,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n",0x39
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout_00,"\t\t\"build\": \"",0xc);
  psVar8 = local_90;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout_00,(local_90->_M_dataplus)._M_p,local_90->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," -C \\\"",6);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\\\" ",3);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(makeArgs->_M_dataplus)._M_p,makeArgs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"all\",\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout_00,"\t\t\"clean\": \"",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout_00,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," -C \\\"",6);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\\\" ",3);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(makeArgs->_M_dataplus)._M_p,makeArgs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"clean\",\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout_00,"\t\t\"quick\": \"",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout_00,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," -C \\\"",6);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\\\" ",3);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(makeArgs->_M_dataplus)._M_p,makeArgs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"install\",\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout_00,"\t\t\"targets\":[\n",0xe);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"all","");
  AppendTarget(local_a8,fout_00,&local_c8,psVar8,makeArgs,path,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"clean","");
  AppendTarget(local_a8,fout_00,&local_c8,psVar8,makeArgs,path,path);
  local_88 = path;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (local_a8->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  puVar11 = (pcVar2->LocalGenerators).
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (pcVar2->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != local_58) {
    do {
      this_00 = (puVar11->_M_t).
                super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t
                .super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pcVar3 = (psVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar3,pcVar3 + psVar8->_M_string_length);
      psVar8 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                         ((puVar11->_M_t).
                          super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                          .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
      local_60 = puVar11;
      if (local_80._M_string_length == psVar8->_M_string_length) {
        if (local_80._M_string_length == 0) {
          local_9c = (undefined4)CONCAT71((int7)((ulong)psVar8 >> 8),1);
        }
        else {
          iVar5 = bcmp(local_80._M_dataplus._M_p,(psVar8->_M_dataplus)._M_p,
                       local_80._M_string_length);
          local_9c = CONCAT31((int3)((uint)iVar5 >> 8),iVar5 == 0);
        }
      }
      else {
        local_9c = 0;
      }
      puVar4 = *(pointer *)
                ((long)&(this_00->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
      for (puVar12 = (this_00->GeneratorTargets).
                     super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar4;
          puVar12 = puVar12 + 1) {
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((puVar12->_M_t).
                            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                            .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        TVar6 = cmGeneratorTarget::GetType
                          ((puVar12->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (TVar6 < UTILITY) {
          AppendTarget(local_a8,local_98,psVar8,local_90,makeArgs,&local_80,local_88);
          local_c8._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
          local_c8._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
          local_c8.field_2._M_allocated_capacity = 5;
          local_c8.field_2._8_8_ = (long)"preinstall/fast" + 10;
          views._M_len = 2;
          views._M_array = (iterator)&local_c8;
          cmCatViews_abi_cxx11_(&local_50,views);
          AppendTarget(local_a8,local_98,&local_50,local_90,makeArgs,&local_80,local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else if (TVar6 == UTILITY) {
          local_c8._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
          local_c8._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
          __str._M_str = "Nightly";
          __str._M_len = 7;
          iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_c8,0,7,__str
                            );
          if ((iVar5 != 0) || (iVar5 = std::__cxx11::string::compare((char *)psVar8), iVar5 == 0)) {
            local_c8._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
            local_c8._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
            __str_00._M_str = "Continuous";
            __str_00._M_len = 10;
            iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_c8,0,10,
                               __str_00);
            if ((iVar5 != 0) || (iVar5 = std::__cxx11::string::compare((char *)psVar8), iVar5 == 0))
            {
              local_c8._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
              local_c8._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
              __str_01._M_str = "Experimental";
              __str_01._M_len = 0xc;
              iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_c8,0,0xc
                                 ,__str_01);
              if ((iVar5 != 0) ||
                 (iVar5 = std::__cxx11::string::compare((char *)psVar8), iVar5 == 0)) {
                AppendTarget(local_a8,local_98,psVar8,local_90,makeArgs,&local_80,local_88);
              }
            }
          }
        }
        else if ((TVar6 == GLOBAL_TARGET) && ((char)local_9c != '\0')) {
          iVar5 = std::__cxx11::string::compare((char *)psVar8);
          if (iVar5 == 0) {
            pcVar1 = ((local_60->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"CMAKE_EDIT_COMMAND","");
            cVar9 = cmMakefile::GetDefinition(pcVar1,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((cVar9.Value == (string *)0x0) ||
               (pcVar10 = strstr(((cVar9.Value)->_M_dataplus)._M_p,"ccmake"), pcVar10 != (char *)0x0
               )) goto LAB_003f96e0;
          }
          AppendTarget(local_a8,local_98,psVar8,local_90,makeArgs,&local_80,local_88);
        }
LAB_003f96e0:
      }
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      puVar11 = local_60 + 1;
    } while (puVar11 != local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_98,"\t] }\n",5);
  return;
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator& lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg.GetMakefile();
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string& makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  std::string const& homeOutputDir = lg.GetBinaryDirectory();

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << homeOutputDir << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (const auto& localGen : this->GlobalGenerator->GetLocalGenerators()) {
    const auto& targets = localGen->GetGeneratorTargets();
    std::string currentDir = localGen->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == localGen->GetBinaryDirectory());

    for (const auto& target : targets) {
      std::string const& targetName = target->GetName();
      switch (target->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              cmValue editCommand =
                localGen->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (!editCommand ||
                  strstr(editCommand->c_str(), "ccmake") != nullptr) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                               homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if ((cmHasLiteralPrefix(targetName, "Nightly") &&
               (targetName != "Nightly")) ||
              (cmHasLiteralPrefix(targetName, "Continuous") &&
               (targetName != "Continuous")) ||
              (cmHasLiteralPrefix(targetName, "Experimental") &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          std::string fastTarget = cmStrCat(targetName, "/fast");
          this->AppendTarget(fout, fastTarget, make, makeArgs, currentDir,
                             homeOutputDir);

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    localGen->GetIndividualFileTargets(objectFileTargets);
    for (std::string const& f : objectFileTargets) {
      this->AppendTarget(fout, f, make, makeArgs, currentDir, homeOutputDir);
    }
  }

  fout << "\t] }\n";
}